

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndTable(void)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImPoolIdx IVar6;
  ImGuiTableColumn *pIVar7;
  uint *puVar8;
  ImGuiTable *pIVar9;
  bool bVar10;
  undefined1 uVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [64];
  ImGuiTable *in_stack_00000010;
  ImGuiTable *in_stack_00000030;
  float decoration_size_1;
  float decoration_size;
  ImVec2 backup_outer_max_pos;
  float new_width;
  float new_x2;
  ImGuiTableColumn *column_2;
  ImGuiTableColumn *column_1;
  float neighbor_width_to_keep_visible;
  ImGuiTableColumn *column;
  int column_n;
  float width_spacings;
  float max_pos_x;
  float outer_padding_for_border;
  float inner_content_max_y;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTableFlags flags;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiTable *in_stack_00000110;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  ImGuiMouseButton in_stack_ffffffffffffff34;
  ImGuiTable *in_stack_ffffffffffffff38;
  int i;
  ImGuiTable *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  ImGuiID in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 uVar15;
  float in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float local_98;
  float local_80;
  float fStack_7c;
  ImDrawList *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  float local_34;
  undefined1 extraout_var [56];
  
  pIVar5 = GImGui;
  pIVar9 = GImGui->CurrentTable;
  if (pIVar9 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x48c,"void ImGui::EndTable()");
  }
  if ((pIVar9->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(_new_width);
  }
  uVar1 = pIVar9->Flags;
  pIVar2 = pIVar9->InnerWindow;
  pIVar3 = pIVar9->OuterWindow;
  if (pIVar2 != pIVar5->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x49a,"void ImGui::EndTable()");
  }
  bVar10 = true;
  if (pIVar3 != pIVar2) {
    bVar10 = pIVar3 == pIVar2->ParentWindow;
  }
  if (!bVar10) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x49b,"void ImGui::EndTable()");
  }
  if ((pIVar9->IsInsideRow & 1U) != 0) {
    TableEndRow(in_stack_00000010);
  }
  if (((((uVar1 & 0x20) != 0) && (pIVar9->HoveredColumnBody != -1)) &&
      (bVar10 = IsAnyItemHovered(), !bVar10)) &&
     (bVar10 = IsMouseReleased(in_stack_ffffffffffffff34), bVar10)) {
    TableOpenContextMenu((int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  }
  (pIVar2->DC).PrevLineSize = pIVar9->HostBackupPrevLineSize;
  (pIVar2->DC).CurrLineSize = pIVar9->HostBackupCurrLineSize;
  (pIVar2->DC).CursorMaxPos = pIVar9->HostBackupCursorMaxPos;
  fVar13 = pIVar9->RowPosY2;
  fVar12 = (pIVar2->DC).CursorPos.y;
  if ((pIVar9->RowPosY2 != fVar12) || (NAN(pIVar9->RowPosY2) || NAN(fVar12))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x4aa,"void ImGui::EndTable()");
  }
  if (pIVar2 == pIVar3) {
    if ((uVar1 & 0x20000) == 0) {
      fVar12 = ImMax<float>((pIVar9->OuterRect).Max.y,fVar13);
      (pIVar9->InnerRect).Max.y = fVar12;
      (pIVar9->OuterRect).Max.y = fVar12;
    }
  }
  else {
    (pIVar2->DC).CursorMaxPos.y = fVar13;
  }
  fVar12 = ImMax<float>((pIVar9->WorkRect).Max.y,(pIVar9->OuterRect).Max.y);
  (pIVar9->WorkRect).Max.y = fVar12;
  fVar12 = ImRect::GetHeight(&pIVar9->OuterRect);
  pIVar9->LastOuterHeight = fVar12;
  if ((pIVar9->Flags & 0x1000000U) != 0) {
    in_stack_ffffffffffffff64 = 0;
    local_98 = 1.0;
    if ((pIVar9->Flags & 0x400U) == 0) {
      local_98 = 0.0;
    }
    fVar12 = (pIVar9->InnerWindow->DC).CursorMaxPos.x;
    local_34 = fVar12;
    if (pIVar9->RightMostEnabledColumn != -1) {
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffff40,
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      local_34 = ImMax<float>(fVar12,(pIVar7->WorkMaxX + pIVar9->CellPaddingX +
                                     pIVar9->OuterPaddingX) - local_98);
      in_stack_ffffffffffffff60 = fVar12;
    }
    if (pIVar9->ResizedColumn != -1) {
      local_34 = ImMax<float>(local_34,pIVar9->ResizeLockMinContentsX2);
    }
    (pIVar9->InnerWindow->DC).CursorMaxPos.x = local_34;
  }
  if ((uVar1 & 0x100000) == 0) {
    ImDrawList::PopClipRect
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  ImVector<ImVec4>::back
            ((ImVector<ImVec4> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (ImVec4 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  (pIVar2->ClipRect).Min = local_44;
  (pIVar2->ClipRect).Max = local_3c;
  if ((uVar1 & 0x780) != 0) {
    TableDrawBorders(in_stack_00000030);
  }
  ImDrawListSplitter::SetCurrentChannel
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (ImDrawList *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  if ((pIVar9->Flags & 0x100000U) == 0) {
    TableMergeDrawChannels(in_stack_00000110);
  }
  ImDrawListSplitter::Merge
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  pIVar9->ColumnsAutoFitWidth =
       pIVar9->CellPaddingX * 2.0 * (float)(int)pIVar9->ColumnsEnabledCount +
       pIVar9->OuterPaddingX + pIVar9->OuterPaddingX +
       (pIVar9->CellSpacingX1 + pIVar9->CellSpacingX2) * (float)(pIVar9->ColumnsEnabledCount + -1);
  for (local_4c = 0; i = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
      local_4c < pIVar9->ColumnsCount; local_4c = local_4c + 1) {
    if ((pIVar9->EnabledMaskByIndex & 1L << ((byte)local_4c & 0x3f)) != 0) {
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffff40,i);
      if (((pIVar7->Flags & 8U) == 0) || ((pIVar7->Flags & 0x10U) != 0)) {
        fVar12 = TableGetColumnWidthAuto
                           (in_stack_ffffffffffffff40,(ImGuiTableColumn *)in_stack_ffffffffffffff38)
        ;
        pIVar9->ColumnsAutoFitWidth = fVar12 + pIVar9->ColumnsAutoFitWidth;
      }
      else {
        pIVar9->ColumnsAutoFitWidth = pIVar7->WidthRequest + pIVar9->ColumnsAutoFitWidth;
      }
    }
  }
  if (((pIVar9->Flags & 0x1000000U) == 0) && (pIVar2 != pIVar3)) {
    (pIVar2->Scroll).x = 0.0;
  }
  else if ((pIVar9->LastResizedColumn != -1) &&
          (((pIVar9->ResizedColumn == -1 && ((pIVar2->ScrollbarX & 1U) != 0)) &&
           (pIVar9->InstanceInteracted == pIVar9->InstanceCurrent)))) {
    pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffff40,i);
    if ((pIVar9->InnerClipRect).Min.x <= pIVar7->MaxX) {
      if ((pIVar9->InnerClipRect).Max.x < pIVar7->MaxX) {
        SetScrollFromPosX((ImGuiWindow *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
    }
    else {
      SetScrollFromPosX((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                        ,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    }
  }
  if ((pIVar9->ResizedColumn != -1) && (pIVar9->InstanceCurrent == pIVar9->InstanceInteracted)) {
    pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)in_stack_ffffffffffffff40,
                        (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    fVar12 = ImFloor(-pIVar9->CellPaddingX + -pIVar9->CellPaddingX +
                     (((((pIVar5->IO).MousePos.x - (pIVar5->ActiveIdClickOffset).x) + 4.0) -
                      pIVar7->MinX) - pIVar9->CellSpacingX1));
    pIVar9->ResizedColumnNextWidth = fVar12;
  }
  puVar8 = ImVector<unsigned_int>::back
                     ((ImVector<unsigned_int> *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  uVar11 = *puVar8 == pIVar9->ID + (int)pIVar9->InstanceCurrent;
  if ((bool)uVar11) {
    uVar15 = pIVar9->HostBackupItemWidthStackSize <= (pIVar3->DC).ItemWidthStack.Size;
    if (!(bool)uVar15) {
      __assert_fail("(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x504,"void ImGui::EndTable()");
    }
    PopID();
    IVar4 = (pIVar3->DC).CursorMaxPos;
    (pIVar2->WorkRect).Min = (pIVar9->HostBackupWorkRect).Min;
    (pIVar2->WorkRect).Max = (pIVar9->HostBackupWorkRect).Max;
    (pIVar2->ParentWorkRect).Min = (pIVar9->HostBackupParentWorkRect).Min;
    (pIVar2->ParentWorkRect).Max = (pIVar9->HostBackupParentWorkRect).Max;
    pIVar2->SkipItems = (bool)(pIVar9->HostSkipItems & 1);
    (pIVar3->DC).CursorPos = (pIVar9->OuterRect).Min;
    (pIVar3->DC).ItemWidth = pIVar9->HostBackupItemWidth;
    (pIVar3->DC).ItemWidthStack.Size = pIVar9->HostBackupItemWidthStackSize;
    (pIVar3->DC).ColumnsOffset.x = (pIVar9->HostBackupColumnsOffset).x;
    if (pIVar2 == pIVar3) {
      auVar14._0_8_ =
           ImRect::GetSize((ImRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      auVar14._8_56_ = extraout_var;
      vmovlpd_avx(auVar14._0_16_);
      ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
      ItemAdd((ImRect *)
              CONCAT17(uVar11,CONCAT16(uVar15,CONCAT24(in_stack_ffffffffffffff5c,
                                                       in_stack_ffffffffffffff58))),
              in_stack_ffffffffffffff54,
              (ImRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    else {
      EndChild();
    }
    local_80 = IVar4.x;
    if ((pIVar9->Flags & 0x10000U) == 0) {
      if (0.0 < (pIVar9->UserOuterSize).x) {
        fVar12 = ImMax<float>(local_80,(pIVar9->OuterRect).Max.x);
        (pIVar3->DC).CursorMaxPos.x = fVar12;
      }
      else {
        if ((pIVar9->Flags & 0x1000000U) == 0) {
          fVar12 = 0.0;
        }
        else {
          fVar12 = (pIVar2->ScrollbarSizes).x;
        }
        fVar12 = ImMax<float>((pIVar3->DC).IdealMaxPos.x,
                              ((pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth + fVar12) -
                              (pIVar9->UserOuterSize).x);
        (pIVar3->DC).IdealMaxPos.x = fVar12;
        fVar12 = ImMin<float>((pIVar9->OuterRect).Max.x,
                              (pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth);
        fVar12 = ImMax<float>(local_80,fVar12);
        (pIVar3->DC).CursorMaxPos.x = fVar12;
      }
    }
    else {
      if ((pIVar9->Flags & 0x1000000U) != 0) {
        __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x523,"void ImGui::EndTable()");
      }
      fVar12 = ImMax<float>(local_80,(pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth);
      (pIVar3->DC).CursorMaxPos.x = fVar12;
    }
    fStack_7c = IVar4.y;
    if (0.0 < (pIVar9->UserOuterSize).y) {
      fVar13 = ImMax<float>(fStack_7c,(pIVar9->OuterRect).Max.y);
      (pIVar3->DC).CursorMaxPos.y = fVar13;
    }
    else {
      if ((pIVar9->Flags & 0x2000000U) == 0) {
        fVar12 = 0.0;
      }
      else {
        fVar12 = (pIVar2->ScrollbarSizes).y;
      }
      fVar12 = ImMax<float>((pIVar3->DC).IdealMaxPos.y,(fVar13 + fVar12) - (pIVar9->UserOuterSize).y
                           );
      (pIVar3->DC).IdealMaxPos.y = fVar12;
      fVar13 = ImMin<float>((pIVar9->OuterRect).Max.y,fVar13);
      fVar13 = ImMax<float>(fStack_7c,fVar13);
      (pIVar3->DC).CursorMaxPos.y = fVar13;
    }
    if ((pIVar9->IsSettingsDirty & 1U) != 0) {
      TableSaveSettings((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
      ;
    }
    pIVar9->IsInitializing = false;
    bVar10 = false;
    if (pIVar5->CurrentWindow == pIVar3) {
      bVar10 = pIVar5->CurrentTable == pIVar9;
    }
    if (!bVar10) {
      __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x542,"void ImGui::EndTable()");
    }
    ImVector<ImGuiPtrOrIndex>::pop_back
              ((ImVector<ImGuiPtrOrIndex> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if ((pIVar5->CurrentTableStack).Size == 0) {
      pIVar9 = (ImGuiTable *)0x0;
    }
    else {
      in_stack_ffffffffffffff38 = (ImGuiTable *)&pIVar5->Tables;
      ImVector<ImGuiPtrOrIndex>::back
                ((ImVector<ImGuiPtrOrIndex> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      pIVar9 = ImPool<ImGuiTable>::GetByIndex
                         ((ImPool<ImGuiTable> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (ImPoolIdx)in_stack_ffffffffffffff2c);
    }
    pIVar5->CurrentTable = pIVar9;
    if (pIVar5->CurrentTable == (ImGuiTable *)0x0) {
      IVar6 = -1;
    }
    else {
      IVar6 = ImPool<ImGuiTable>::GetIndex((ImPool<ImGuiTable> *)pIVar9,in_stack_ffffffffffffff38);
    }
    (pIVar3->DC).CurrentTableIdx = IVar6;
    return;
  }
  __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0x503,"void ImGui::EndTable()");
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = table->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = table->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = table->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    table->DrawSplitter.Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = table->HostBackupWorkRect;
    inner_window->ParentWorkRect = table->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = table->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = table->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = table->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (table->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - table->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (table->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - table->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    g.CurrentTableStack.pop_back();
    g.CurrentTable = g.CurrentTableStack.Size ? g.Tables.GetByIndex(g.CurrentTableStack.back().Index) : NULL;
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}